

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

void tt_get_metrics_incr_overrides(TT_Loader loader,FT_UInt glyph_index)

{
  TT_Face pTVar1;
  FT_Error FVar2;
  undefined1 auStack_48 [4];
  FT_Error error;
  FT_Incremental_MetricsRec incr_metrics;
  FT_UShort advance_height;
  FT_UShort advance_width;
  FT_Short top_bearing;
  FT_Short left_bearing;
  TT_Face face;
  FT_UInt glyph_index_local;
  TT_Loader loader_local;
  
  pTVar1 = loader->face;
  incr_metrics.advance_v._6_2_ = 0;
  incr_metrics.advance_v._4_2_ = 0;
  incr_metrics.advance_v._2_2_ = 0;
  incr_metrics.advance_v._0_2_ = 0;
  if ((((pTVar1->root).internal)->incremental_interface != (FT_Incremental_InterfaceRec *)0x0) &&
     (((pTVar1->root).internal)->incremental_interface->funcs->get_glyph_metrics !=
      (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
    _auStack_48 = (long)loader->left_bearing;
    incr_metrics.bearing_x = 0;
    incr_metrics.bearing_y = (FT_Long)loader->advance;
    incr_metrics.advance = 0;
    FVar2 = (*((pTVar1->root).internal)->incremental_interface->funcs->get_glyph_metrics)
                      (((pTVar1->root).internal)->incremental_interface->object,glyph_index,'\0',
                       (FT_Incremental_MetricsRec *)auStack_48);
    if (FVar2 == 0) {
      loader->left_bearing = (int)(short)_auStack_48;
      loader->advance = (uint)(ushort)incr_metrics.bearing_y;
      loader->top_bearing = (int)incr_metrics.advance_v._4_2_;
      loader->vadvance = (uint)(ushort)incr_metrics.advance_v;
      if (loader->linear_def == '\0') {
        loader->linear_def = '\x01';
        loader->linear = (uint)(ushort)incr_metrics.bearing_y;
      }
    }
  }
  return;
}

Assistant:

static void
  tt_get_metrics_incr_overrides( TT_Loader  loader,
                                 FT_UInt    glyph_index )
  {
    TT_Face  face = loader->face;

    FT_Short   left_bearing = 0, top_bearing = 0;
    FT_UShort  advance_width = 0, advance_height = 0;


    /* If this is an incrementally loaded font check whether there are */
    /* overriding metrics for this glyph.                              */
    if ( face->root.internal->incremental_interface                           &&
         face->root.internal->incremental_interface->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  incr_metrics;
      FT_Error                   error;


      incr_metrics.bearing_x = loader->left_bearing;
      incr_metrics.bearing_y = 0;
      incr_metrics.advance   = loader->advance;
      incr_metrics.advance_v = 0;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, FALSE, &incr_metrics );
      if ( error )
        goto Exit;

      left_bearing  = (FT_Short)incr_metrics.bearing_x;
      advance_width = (FT_UShort)incr_metrics.advance;

#if 0

      /* GWW: Do I do the same for vertical metrics? */
      incr_metrics.bearing_x = 0;
      incr_metrics.bearing_y = loader->top_bearing;
      incr_metrics.advance   = loader->vadvance;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, TRUE, &incr_metrics );
      if ( error )
        goto Exit;

      top_bearing    = (FT_Short)incr_metrics.bearing_y;
      advance_height = (FT_UShort)incr_metrics.advance;

#endif /* 0 */

      loader->left_bearing = left_bearing;
      loader->advance      = advance_width;
      loader->top_bearing  = top_bearing;
      loader->vadvance     = advance_height;

      if ( !loader->linear_def )
      {
        loader->linear_def = 1;
        loader->linear     = advance_width;
      }
    }

  Exit:
    return;
  }